

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O0

void __thiscall rtosc::AutomationMgr::clearSlotSub(AutomationMgr *this,int slot_id,int sub)

{
  undefined1 *puVar1;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  Automation *a;
  
  if ((((in_ESI < (int)in_RDI[1]) && (-1 < in_ESI)) && (in_EDX < *(int *)((long)in_RDI + 0xc))) &&
     (-1 < in_EDX)) {
    puVar1 = (undefined1 *)(*(long *)(*in_RDI + (long)in_ESI * 0xa0 + 0x98) + (long)in_EDX * 0xb8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    *(undefined4 *)(puVar1 + 4) = 0;
    memset(puVar1 + 8,0,0x80);
    puVar1[0x88] = 0;
    *(undefined4 *)(puVar1 + 0x8c) = 0;
    *(undefined4 *)(puVar1 + 0x90) = 0;
    *(undefined4 *)(puVar1 + 0x94) = 0;
    *(undefined4 *)(puVar1 + 0xb0) = 0x42c80000;
    *(undefined4 *)(puVar1 + 0xb4) = 0;
    *(undefined4 *)(in_RDI + 10) = 1;
  }
  return;
}

Assistant:

void AutomationMgr::clearSlotSub(int slot_id, int sub)
{
    if(slot_id >= nslots || slot_id < 0 || sub >= per_slot || sub < 0)
        return;
    auto &a = slots[slot_id].automations[sub];
    a.used    = false;
    a.active  = false;
    a.relative = false;
    a.param_base_value = false;
    memset(a.param_path, 0, sizeof(a.param_path));
    a.param_type = 0;
    a.param_min  = 0;
    a.param_max  = 0;
    a.param_step = 0;
    a.map.gain   = 100;
    a.map.offset = 0;

    damaged = true;
}